

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O0

void fai_save(faidx_t *fai,FILE *fp)

{
  ulong uVar1;
  khint_t kVar2;
  faidx1_t *pfVar3;
  undefined4 local_38;
  faidx1_t x;
  int i;
  khint_t k;
  FILE *fp_local;
  faidx_t *fai_local;
  
  for (x.offset._0_4_ = 0; (int)x.offset < fai->n; x.offset._0_4_ = (int)x.offset + 1) {
    kVar2 = kh_get_s(fai->hash,fai->name[(int)x.offset]);
    pfVar3 = fai->hash->vals + kVar2;
    uVar1._0_4_ = pfVar3->line_len;
    uVar1._4_4_ = pfVar3->line_blen;
    fprintf((FILE *)fp,"%s\t%d\t%lld\t%d\t%d\n",fai->name[(int)x.offset],pfVar3->len & 0xffffffff,
            pfVar3->offset,uVar1 >> 0x20,(undefined4)uVar1);
  }
  return;
}

Assistant:

void fai_save(const faidx_t *fai, FILE *fp)
{
    khint_t k;
    int i;
    for (i = 0; i < fai->n; ++i) {
        faidx1_t x;
        k = kh_get(s, fai->hash, fai->name[i]);
        x = kh_value(fai->hash, k);
#ifdef _WIN32
        fprintf(fp, "%s\t%d\t%ld\t%d\t%d\n", fai->name[i], (int)x.len, (long)x.offset, (int)x.line_blen, (int)x.line_len);
#else
        fprintf(fp, "%s\t%d\t%lld\t%d\t%d\n", fai->name[i], (int)x.len, (long long)x.offset, (int)x.line_blen, (int)x.line_len);
#endif
    }
}